

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void openjtalk_resume(OpenJTalk *oj)

{
  SpeakData *pSVar1;
  int iVar2;
  long lVar3;
  char *mes;
  undefined8 uStack_38;
  int aiStack_30 [4];
  undefined8 uStack_20;
  undefined8 uStack_18;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    return;
  }
  if (((g_psd->finished == false) && (g_psd->paused == true)) && (g_psd->length != 0)) {
    if (g_verbose) {
      mes = anon_var_dwarf_57a;
      if (g_psd->counter == 0) {
        mes = anon_var_dwarf_563;
      }
      console_message(mes);
    }
    pSVar1 = g_psd;
    g_psd->finished = false;
    pSVar1->stop = false;
    pSVar1->pause = false;
    pSVar1->speaking = false;
    pSVar1->paused = false;
    aiStack_30[0] = Pa_GetDefaultOutputDevice();
    if (aiStack_30[0] != -1) {
      aiStack_30[1] = 1;
      aiStack_30[2] = 8;
      aiStack_30[3] = 0;
      lVar3 = Pa_GetDeviceInfo(aiStack_30[0]);
      uStack_20 = *(undefined8 *)(lVar3 + 0x28);
      uStack_18 = 0;
      iVar2 = Pa_OpenStream(((double)CONCAT44(0x45300000,(int)(g_psd->sampling_frequency >> 0x20)) -
                            1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)g_psd->sampling_frequency) -
                            4503599627370496.0),&uStack_38,0,aiStack_30,0x400,1,speak_pa_callback,
                            g_psd);
      if ((iVar2 == 0) &&
         (iVar2 = Pa_SetStreamFinishedCallback(uStack_38,speak_pa_finished), iVar2 == 0)) {
        g_psd->speaking = true;
        iVar2 = Pa_StartStream(uStack_38);
        if (iVar2 == 0) {
          sleep_internal(100);
          return;
        }
      }
    }
    if (g_psd->data != (short *)0x0) {
      free(g_psd->data);
      g_psd->data = (short *)0x0;
    }
    pSVar1 = g_psd;
    g_psd->finished = true;
    pSVar1->stop = false;
    pSVar1->pause = false;
    pSVar1->speaking = false;
    pSVar1->paused = false;
    return;
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_resume(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	if (g_psd->finished)
	{
		return;
	}

	if (!g_psd->paused)
	{
		return;
	}

	if (g_psd->length != 0)
	{
		speak_async(oj);
	}
}